

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O2

ssize_t peek_at_header(archive_read_filter *filter,int *pbits,private_data_conflict *state)

{
  byte bVar1;
  private_data_conflict *ppVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  size_t sVar9;
  size_t min;
  ssize_t avail;
  uint local_44;
  int *local_40;
  private_data_conflict *local_38;
  
  sVar7 = 10;
  pvVar5 = __archive_read_filter_ahead(filter,10,&avail);
  if (pvVar5 == (void *)0x0) {
    return 0;
  }
  if (avail == 0) {
    return 0;
  }
  iVar4 = bcmp(pvVar5,anon_var_dwarf_18bd9,3);
  if (iVar4 == 0) {
    bVar1 = *(byte *)((long)pvVar5 + 3);
    uVar8 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (state != (private_data_conflict *)0x0) {
        state->mtime = *(uint32_t *)((long)pvVar5 + 4);
      }
      local_38 = state;
      if ((bVar1 & 4) != 0) {
        pvVar5 = __archive_read_filter_ahead(filter,0xc,&avail);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
        sVar7 = (ulong)*(ushort *)((long)pvVar5 + 10) + 0xc;
      }
      min = sVar7;
      sVar9 = sVar7;
      uVar3 = (uint)bVar1;
      local_40 = pbits;
      if ((bVar1 & 8) != 0) {
        do {
          local_44 = uVar3;
          min = sVar9 + 1;
          if (avail <= (long)sVar9) {
            if (0x100000 < avail) {
              return 0;
            }
            pvVar5 = __archive_read_filter_ahead(filter,min,&avail);
            if (pvVar5 == (void *)0x0) {
              return 0;
            }
          }
          ppVar2 = local_38;
          pcVar6 = (char *)((long)pvVar5 + sVar9);
          sVar9 = min;
          uVar3 = local_44;
        } while (*pcVar6 != '\0');
        uVar8 = local_44;
        if (local_38 != (private_data_conflict *)0x0) {
          free(local_38->name);
          pcVar6 = strdup((char *)(sVar7 + (long)pvVar5));
          ppVar2->name = pcVar6;
          uVar8 = local_44;
        }
      }
      if (0xf < (byte)uVar8) {
        sVar7 = min;
        do {
          min = sVar7 + 1;
          if (avail <= (long)sVar7) {
            if (0x100000 < avail) {
              return 0;
            }
            pvVar5 = __archive_read_filter_ahead(filter,min,&avail);
            if (pvVar5 == (void *)0x0) {
              return 0;
            }
          }
          pcVar6 = (char *)((long)pvVar5 + sVar7);
          sVar7 = min;
        } while (*pcVar6 != '\0');
      }
      if ((uVar8 & 2) != 0) {
        min = min + 2;
        pvVar5 = __archive_read_filter_ahead(filter,min,&avail);
        if (pvVar5 == (void *)0x0) {
          return 0;
        }
      }
      if (local_40 == (int *)0x0) {
        return min;
      }
      *local_40 = 0x1b;
      return min;
    }
  }
  return 0;
}

Assistant:

static ssize_t
peek_at_header(struct archive_read_filter *filter, int *pbits,
#ifdef HAVE_ZLIB_H
	       struct private_data *state
#else
	       void *state
#endif
	      )
{
	const unsigned char *p;
	ssize_t avail, len;
	int bits = 0;
	int header_flags;
#ifndef HAVE_ZLIB_H
	(void)state; /* UNUSED */
#endif

	/* Start by looking at the first ten bytes of the header, which
	 * is all fixed layout. */
	len = 10;
	p = __archive_read_filter_ahead(filter, len, &avail);
	if (p == NULL || avail == 0)
		return (0);
	/* We only support deflation- third byte must be 0x08. */
	if (memcmp(p, "\x1F\x8B\x08", 3) != 0)
		return (0);
	bits += 24;
	if ((p[3] & 0xE0)!= 0)	/* No reserved flags set. */
		return (0);
	bits += 3;
	header_flags = p[3];
	/* Bytes 4-7 are mod time in little endian. */
#ifdef HAVE_ZLIB_H
	if (state)
		state->mtime = archive_le32dec(p + 4);
#endif
	/* Byte 8 is deflate flags. */
	/* XXXX TODO: return deflate flags back to consume_header for use
	   in initializing the decompressor. */
	/* Byte 9 is OS. */

	/* Optional extra data:  2 byte length plus variable body. */
	if (header_flags & 4) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
		len += ((int)p[len + 1] << 8) | (int)p[len];
		len += 2;
	}

	/* Null-terminated optional filename. */
	if (header_flags & 8) {
#ifdef HAVE_ZLIB_H
		ssize_t file_start = len;
#endif
		do {
			++len;
			if (avail < len) {
				if (avail > MAX_FILENAME_LENGTH) {
					return (0);
				}
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			}
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);

#ifdef HAVE_ZLIB_H
		if (state) {
			/* Reset the name in case of repeat header reads. */
			free(state->name);
			state->name = strdup((const char *)&p[file_start]);
		}
#endif
	}

	/* Null-terminated optional comment. */
	if (header_flags & 16) {
		do {
			++len;
			if (avail < len) {
				if (avail > MAX_COMMENT_LENGTH) {
					return (0);
				}
				p = __archive_read_filter_ahead(filter,
				    len, &avail);
			}
			if (p == NULL)
				return (0);
		} while (p[len - 1] != 0);
	}

	/* Optional header CRC */
	if ((header_flags & 2)) {
		p = __archive_read_filter_ahead(filter, len + 2, &avail);
		if (p == NULL)
			return (0);
#if 0
	int hcrc = ((int)p[len + 1] << 8) | (int)p[len];
	int crc = /* XXX TODO: Compute header CRC. */;
	if (crc != hcrc)
		return (0);
	bits += 16;
#endif
		len += 2;
	}

	if (pbits != NULL)
		*pbits = bits;
	return (len);
}